

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMan.c
# Opt level: O3

void Mpm_ManStop(Mpm_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Vec_Mem_t *pVVar3;
  word *pwVar4;
  Vec_Wrd_t *pVVar5;
  int *piVar6;
  Hsh_IntMan_t *__ptr;
  Vec_Wec_t *__ptr_00;
  void *pvVar7;
  Vec_Ptr_t *__ptr_01;
  void **ppvVar8;
  Mmr_Step_t *__ptr_02;
  bool bVar9;
  int iVar10;
  FILE *__stream;
  Mpm_Par_t *pMVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  Vec_Int_t *pVVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  
  pMVar11 = p->pPars;
  if ((pMVar11->fUseTruth != 0) && (pMVar11->fVeryVerbose != 0)) {
    __stream = fopen("truths.txt","wb");
    pVVar3 = p->vTtMem;
    if (_stdout == __stream) {
      printf("Memory vector has %d entries: \n",(ulong)(uint)pVVar3->nEntries);
    }
    if (0 < pVVar3->nEntries) {
      uVar13 = 0;
      do {
        pwVar4 = pVVar3->ppPages[uVar13 >> ((byte)pVVar3->LogPageSze & 0x1f)];
        if (pwVar4 == (word *)0x0) break;
        uVar1 = pVVar3->nEntrySize;
        if (0 < (int)uVar1) {
          uVar2 = pVVar3->PageMask;
          uVar14 = (ulong)uVar1;
          do {
            lVar16 = 0x3c;
            do {
              uVar12 = (uint)(pwVar4[(long)(int)((uVar2 & uVar13) * uVar1) + (uVar14 - 1)] >>
                             ((byte)lVar16 & 0x3f)) & 0xf;
              if (uVar12 < 10) {
                fprintf(__stream,"%d");
              }
              else {
                fputc(uVar12 + 0x37,__stream);
              }
              lVar16 = lVar16 + -4;
            } while (lVar16 != -4);
            bVar9 = 1 < (long)uVar14;
            uVar14 = uVar14 - 1;
          } while (bVar9);
        }
        fputc(10,__stream);
        uVar13 = uVar13 + 1;
      } while ((int)uVar13 < pVVar3->nEntries);
    }
    fclose(__stream);
    uVar13 = p->vTtMem->nEntries;
    printf("Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n",
           (double)(int)uVar13 * ((double)p->nTruWords * 16.0 + 1.0) * 9.5367431640625e-07,
           (ulong)uVar13,(ulong)(uint)p->nLutSize,"truths.txt");
    pMVar11 = p->pPars;
  }
  if ((pMVar11->fUseDsd != 0) && (pMVar11->fVerbose != 0)) {
    Mpm_ManPrintDsdStats(p);
  }
  pVVar3 = p->vTtMem;
  if (pVVar3 != (Vec_Mem_t *)0x0) {
    pVVar15 = pVVar3->vTable;
    if (pVVar15 != (Vec_Int_t *)0x0) {
      if (pVVar15->pArray != (int *)0x0) {
        free(pVVar15->pArray);
        pVVar3->vTable->pArray = (int *)0x0;
        pVVar15 = pVVar3->vTable;
        if (pVVar15 == (Vec_Int_t *)0x0) goto LAB_0047cb5d;
      }
      free(pVVar15);
      pVVar3->vTable = (Vec_Int_t *)0x0;
    }
LAB_0047cb5d:
    pVVar15 = pVVar3->vNexts;
    if (pVVar15 != (Vec_Int_t *)0x0) {
      if (pVVar15->pArray != (int *)0x0) {
        free(pVVar15->pArray);
        pVVar3->vNexts->pArray = (int *)0x0;
        pVVar15 = pVVar3->vNexts;
        if (pVVar15 == (Vec_Int_t *)0x0) goto LAB_0047cb99;
      }
      free(pVVar15);
      pVVar3->vNexts = (Vec_Int_t *)0x0;
    }
LAB_0047cb99:
    pVVar3 = p->vTtMem;
    iVar10 = pVVar3->iPage;
    if (-1 < iVar10) {
      lVar16 = -1;
      do {
        if (pVVar3->ppPages[lVar16 + 1] != (word *)0x0) {
          free(pVVar3->ppPages[lVar16 + 1]);
          pVVar3->ppPages[lVar16 + 1] = (word *)0x0;
          iVar10 = pVVar3->iPage;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < iVar10);
    }
    if (pVVar3->ppPages != (word **)0x0) {
      free(pVVar3->ppPages);
    }
    free(pVVar3);
  }
  if (p->pHash != (Hsh_IntMan_t *)0x0) {
    pVVar5 = p->vPerm6;
    pwVar4 = pVVar5->pArray;
    if (pwVar4 != (word *)0x0) {
      free(pwVar4);
    }
    free(pVVar5);
    pVVar15 = p->vMap2Perm;
    piVar6 = pVVar15->pArray;
    if (piVar6 != (int *)0x0) {
      free(piVar6);
    }
    free(pVVar15);
    pVVar15 = p->vConfgRes;
    piVar6 = pVVar15->pArray;
    if (piVar6 != (int *)0x0) {
      free(piVar6);
    }
    free(pVVar15);
    pVVar15 = p->pHash->vData;
    piVar6 = pVVar15->pArray;
    if (piVar6 != (int *)0x0) {
      free(piVar6);
    }
    free(pVVar15);
    __ptr = p->pHash;
    pVVar15 = __ptr->vTable;
    piVar6 = pVVar15->pArray;
    if (piVar6 != (int *)0x0) {
      free(piVar6);
    }
    free(pVVar15);
    pVVar5 = __ptr->vObjs;
    pwVar4 = pVVar5->pArray;
    if (pwVar4 != (word *)0x0) {
      free(pwVar4);
    }
    free(pVVar5);
    free(__ptr);
  }
  __ptr_00 = p->vNpnConfigs;
  if (__ptr_00 == (Vec_Wec_t *)0x0) goto LAB_0047cd2a;
  iVar10 = __ptr_00->nCap;
  pVVar15 = __ptr_00->pArray;
  if (iVar10 < 1) {
    if (pVVar15 != (Vec_Int_t *)0x0) goto LAB_0047cd12;
  }
  else {
    lVar16 = 8;
    lVar18 = 0;
    do {
      pvVar7 = *(void **)((long)&pVVar15->nCap + lVar16);
      if (pvVar7 != (void *)0x0) {
        free(pvVar7);
        pVVar15 = __ptr_00->pArray;
        *(undefined8 *)((long)&pVVar15->nCap + lVar16) = 0;
        iVar10 = __ptr_00->nCap;
      }
      lVar18 = lVar18 + 1;
      lVar16 = lVar16 + 0x10;
    } while (lVar18 < iVar10);
LAB_0047cd12:
    free(pVVar15);
  }
  free(__ptr_00);
  p->vNpnConfigs = (Vec_Wec_t *)0x0;
LAB_0047cd2a:
  __ptr_01 = p->vTemp;
  ppvVar8 = __ptr_01->pArray;
  if (ppvVar8 != (void **)0x0) {
    free(ppvVar8);
  }
  free(__ptr_01);
  __ptr_02 = p->pManCuts;
  if (-1 < __ptr_02->uMask) {
    lVar16 = 0;
    do {
      lVar18 = lVar16 * 0x38;
      iVar10 = *(int *)((long)__ptr_02 + lVar18 + 0x34);
      if (0 < iVar10) {
        lVar17 = 0;
        do {
          pvVar7 = *(void **)(*(long *)((long)__ptr_02 + lVar18 + 0x38) + lVar17 * 8);
          if (pvVar7 != (void *)0x0) {
            free(pvVar7);
            iVar10 = *(int *)((long)__ptr_02 + lVar18 + 0x34);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < iVar10);
      }
      pvVar7 = *(void **)((long)__ptr_02 + lVar18 + 0x38);
      if (pvVar7 != (void *)0x0) {
        free(pvVar7);
        *(undefined8 *)((long)__ptr_02 + lVar18 + 0x38) = 0;
      }
      pvVar7 = *(void **)((long)__ptr_02 + lVar18 + 0x48);
      if (pvVar7 != (void *)0x0) {
        free(pvVar7);
        *(undefined8 *)((long)__ptr_02 + lVar18 + 0x48) = 0;
      }
      bVar9 = lVar16 < __ptr_02->uMask;
      lVar16 = lVar16 + 1;
    } while (bVar9);
  }
  free(__ptr_02);
  ppvVar8 = (p->vFreeUnits).pArray;
  if (ppvVar8 != (void **)0x0) {
    free(ppvVar8);
    (p->vFreeUnits).pArray = (void **)0x0;
  }
  piVar6 = (p->vCutBests).pArray;
  if (piVar6 != (int *)0x0) {
    free(piVar6);
    (p->vCutBests).pArray = (int *)0x0;
  }
  piVar6 = (p->vCutLists).pArray;
  if (piVar6 != (int *)0x0) {
    free(piVar6);
    (p->vCutLists).pArray = (int *)0x0;
  }
  piVar6 = (p->vMigRefs).pArray;
  if (piVar6 != (int *)0x0) {
    free(piVar6);
    (p->vMigRefs).pArray = (int *)0x0;
  }
  piVar6 = (p->vMapRefs).pArray;
  if (piVar6 != (int *)0x0) {
    free(piVar6);
    (p->vMapRefs).pArray = (int *)0x0;
  }
  piVar6 = (p->vEstRefs).pArray;
  if (piVar6 != (int *)0x0) {
    free(piVar6);
    (p->vEstRefs).pArray = (int *)0x0;
  }
  piVar6 = (p->vRequireds).pArray;
  if (piVar6 != (int *)0x0) {
    free(piVar6);
    (p->vRequireds).pArray = (int *)0x0;
  }
  piVar6 = (p->vTimes).pArray;
  if (piVar6 != (int *)0x0) {
    free(piVar6);
    (p->vTimes).pArray = (int *)0x0;
  }
  piVar6 = (p->vAreas).pArray;
  if (piVar6 != (int *)0x0) {
    free(piVar6);
    (p->vAreas).pArray = (int *)0x0;
  }
  piVar6 = (p->vEdges).pArray;
  if (piVar6 != (int *)0x0) {
    free(piVar6);
  }
  free(p);
  return;
}

Assistant:

void Mpm_ManStop( Mpm_Man_t * p )
{
    if ( p->pPars->fUseTruth && p->pPars->fVeryVerbose )
    {
        char * pFileName = "truths.txt";
        FILE * pFile = fopen( pFileName, "wb" );
        Vec_MemDump( pFile, p->vTtMem );
        fclose( pFile );
        printf( "Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n", 
            Vec_MemEntryNum(p->vTtMem), p->nLutSize, pFileName,
            (16.0 * p->nTruWords + 1.0) * Vec_MemEntryNum(p->vTtMem) / (1 << 20) );
    }
    if ( p->pPars->fUseDsd && p->pPars->fVerbose )
        Mpm_ManPrintDsdStats( p );
    if ( p->vTtMem ) 
    {
        Vec_MemHashFree( p->vTtMem );
        Vec_MemFree( p->vTtMem );
    }
    if ( p->pHash )
    {
        Vec_WrdFree( p->vPerm6 );
        Vec_IntFree( p->vMap2Perm );
        Vec_IntFree( p->vConfgRes );
        Vec_IntFree( p->pHash->vData );
        Hsh_IntManStop( p->pHash );
    }
    Vec_WecFreeP( &p->vNpnConfigs );
    Vec_PtrFree( p->vTemp );
    Mmr_StepStop( p->pManCuts );
    ABC_FREE( p->vFreeUnits.pArray );
    // mapping attributes
    ABC_FREE( p->vCutBests.pArray );
    ABC_FREE( p->vCutLists.pArray );
    ABC_FREE( p->vMigRefs.pArray );
    ABC_FREE( p->vMapRefs.pArray );
    ABC_FREE( p->vEstRefs.pArray );
    ABC_FREE( p->vRequireds.pArray );
    ABC_FREE( p->vTimes.pArray );
    ABC_FREE( p->vAreas.pArray );
    ABC_FREE( p->vEdges.pArray );
    ABC_FREE( p );
}